

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v9::detail::write_significand<fmt::v9::appender,char>
                   (appender out,char *significand,int significand_size,int integral_size,
                   char decimal_point)

{
  appender aVar1;
  long lVar2;
  ulong uVar3;
  
  aVar1 = copy_str_noinline<char,char_const*,fmt::v9::appender>
                    (significand,significand + integral_size,out);
  if (decimal_point != '\0') {
    lVar2 = *(long *)((long)aVar1.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                            container + 0x10);
    uVar3 = lVar2 + 1;
    if (*(ulong *)((long)aVar1.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container
                  + 0x18) < uVar3) {
      (*(code *)**(undefined8 **)
                  aVar1.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)
                (aVar1.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container);
      lVar2 = *(long *)((long)aVar1.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                              container + 0x10);
      uVar3 = lVar2 + 1;
    }
    *(ulong *)((long)aVar1.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container +
              0x10) = uVar3;
    *(char *)(*(long *)((long)aVar1.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                              container + 8) + lVar2) = decimal_point;
    aVar1 = copy_str_noinline<char,char_const*,fmt::v9::appender>
                      (significand + integral_size,significand + significand_size,aVar1);
    return (appender)aVar1.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
  }
  return (appender)
         aVar1.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR auto write_significand(OutputIt out, const char* significand,
                                     int significand_size, int integral_size,
                                     Char decimal_point) -> OutputIt {
  out = detail::copy_str_noinline<Char>(significand,
                                        significand + integral_size, out);
  if (!decimal_point) return out;
  *out++ = decimal_point;
  return detail::copy_str_noinline<Char>(significand + integral_size,
                                         significand + significand_size, out);
}